

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

bool __thiscall
ImPlot::
ShadedRenderer<ImPlot::GetterXsYs<long_long>,_ImPlot::GetterXsYRef<long_long>,_ImPlot::TransformerLinLin>
::operator()(ShadedRenderer<ImPlot::GetterXsYs<long_long>,_ImPlot::GetterXsYRef<long_long>,_ImPlot::TransformerLinLin>
             *this,ImDrawList *DrawList,ImRect *param_2,ImVec2 *uv,int prim)

{
  ImVec2 IVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  GetterXsYs<long_long> *pGVar8;
  GetterXsYRef<long_long> *pGVar9;
  ImDrawVert *pIVar10;
  uint *puVar11;
  uint uVar12;
  long lVar13;
  ImPlotContext *gp;
  float fVar14;
  float fVar15;
  ImVec2 IVar16;
  float fVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  float fVar20;
  double dVar21;
  float fVar22;
  float fVar23;
  double dVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  
  pGVar8 = this->Getter1;
  pGVar9 = this->Getter2;
  iVar4 = pGVar8->Count;
  iVar5 = this->Transformer->YAxis;
  iVar6 = pGVar9->Count;
  lVar13 = (long)(((pGVar8->Offset + prim + 1) % iVar4 + iVar4) % iVar4) * (long)pGVar8->Stride;
  IVar1 = GImPlot->PixelRange[iVar5].Min;
  dVar21 = (double)IVar1.x;
  dVar24 = (double)IVar1.y;
  dVar2 = (GImPlot->CurrentPlot->XAxis).Range.Min;
  dVar3 = GImPlot->CurrentPlot->YAxis[iVar5].Range.Min;
  fVar14 = (float)(((double)*(long *)((long)pGVar8->Xs + lVar13) - dVar2) * GImPlot->Mx + dVar21);
  fVar15 = (float)(((double)*(long *)((long)pGVar8->Ys + lVar13) - dVar3) * GImPlot->My[iVar5] +
                  dVar24);
  IVar16.x = (float)(((double)*(long *)((long)pGVar9->Xs +
                                       (long)(((prim + 1 + pGVar9->Offset) % iVar6 + iVar6) % iVar6)
                                       * (long)pGVar9->Stride) - dVar2) * GImPlot->Mx + dVar21);
  IVar16.y = (float)((pGVar9->YRef - dVar3) * GImPlot->My[iVar5] + dVar24);
  fVar20 = (this->P12).x;
  fVar22 = (this->P12).y;
  fVar25 = (this->P11).x;
  fVar26 = (this->P11).y;
  fVar17 = fVar15 * fVar25 - fVar14 * fVar26;
  fVar27 = fVar20 * IVar16.y - fVar22 * IVar16.x;
  fVar25 = fVar25 - fVar14;
  fVar20 = fVar20 - IVar16.x;
  fVar23 = fVar22 - IVar16.y;
  fVar28 = fVar23 * fVar25 - (fVar26 - fVar15) * fVar20;
  auVar18._0_4_ = fVar17 * fVar20 - fVar27 * fVar25;
  auVar18._4_4_ = fVar17 * fVar23 - fVar27 * (fVar26 - fVar15);
  auVar18._8_4_ = fVar15 * 0.0 - fVar22 * 0.0;
  auVar18._12_4_ = fVar15 * 0.0 - fVar22 * 0.0;
  auVar19._4_4_ = fVar28;
  auVar19._0_4_ = fVar28;
  auVar19._8_4_ = fVar23;
  auVar19._12_4_ = fVar23;
  auVar19 = divps(auVar18,auVar19);
  DrawList->_VtxWritePtr->pos = this->P11;
  DrawList->_VtxWritePtr->uv = *uv;
  pIVar10 = DrawList->_VtxWritePtr;
  pIVar10->col = this->Col;
  IVar1.y = fVar15;
  IVar1.x = fVar14;
  pIVar10[1].pos = IVar1;
  DrawList->_VtxWritePtr[1].uv = *uv;
  pIVar10 = DrawList->_VtxWritePtr;
  pIVar10[1].col = this->Col;
  pIVar10[2].pos = auVar19._0_8_;
  DrawList->_VtxWritePtr[2].uv = *uv;
  pIVar10 = DrawList->_VtxWritePtr;
  pIVar10[2].col = this->Col;
  pIVar10[3].pos = this->P12;
  DrawList->_VtxWritePtr[3].uv = *uv;
  pIVar10 = DrawList->_VtxWritePtr;
  pIVar10[3].col = this->Col;
  pIVar10[4].pos = IVar16;
  DrawList->_VtxWritePtr[4].uv = *uv;
  pIVar10 = DrawList->_VtxWritePtr;
  pIVar10[4].col = this->Col;
  DrawList->_VtxWritePtr = pIVar10 + 5;
  uVar7 = DrawList->_VtxCurrentIdx;
  puVar11 = DrawList->_IdxWritePtr;
  *puVar11 = uVar7;
  uVar12 = -(uint)(fVar15 < IVar16.y && fVar22 < fVar26 || IVar16.y < fVar15 && fVar26 < fVar22) & 1
  ;
  puVar11[1] = uVar7 + uVar12 + 1;
  puVar11[2] = DrawList->_VtxCurrentIdx + 3;
  puVar11[3] = DrawList->_VtxCurrentIdx + 1;
  puVar11[4] = (uVar12 ^ 3) + DrawList->_VtxCurrentIdx;
  puVar11[5] = DrawList->_VtxCurrentIdx + 4;
  DrawList->_IdxWritePtr = puVar11 + 6;
  DrawList->_VtxCurrentIdx = DrawList->_VtxCurrentIdx + 5;
  (this->P11).x = fVar14;
  (this->P11).y = fVar15;
  (this->P12).x = IVar16.x;
  (this->P12).y = IVar16.y;
  return true;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& /*cull_rect*/, const ImVec2& uv, int prim) const {
        // TODO: Culling
        ImVec2 P21 = Transformer(Getter1(prim+1));
        ImVec2 P22 = Transformer(Getter2(prim+1));
        const int intersect = (P11.y > P12.y && P22.y > P21.y) || (P12.y > P11.y && P21.y > P22.y);
        ImVec2 intersection = Intersection(P11,P21,P12,P22);
        DrawList._VtxWritePtr[0].pos = P11;
        DrawList._VtxWritePtr[0].uv  = uv;
        DrawList._VtxWritePtr[0].col = Col;
        DrawList._VtxWritePtr[1].pos = P21;
        DrawList._VtxWritePtr[1].uv  = uv;
        DrawList._VtxWritePtr[1].col = Col;
        DrawList._VtxWritePtr[2].pos = intersection;
        DrawList._VtxWritePtr[2].uv  = uv;
        DrawList._VtxWritePtr[2].col = Col;
        DrawList._VtxWritePtr[3].pos = P12;
        DrawList._VtxWritePtr[3].uv  = uv;
        DrawList._VtxWritePtr[3].col = Col;
        DrawList._VtxWritePtr[4].pos = P22;
        DrawList._VtxWritePtr[4].uv  = uv;
        DrawList._VtxWritePtr[4].col = Col;
        DrawList._VtxWritePtr += 5;
        DrawList._IdxWritePtr[0] = (ImDrawIdx)(DrawList._VtxCurrentIdx);
        DrawList._IdxWritePtr[1] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1 + intersect);
        DrawList._IdxWritePtr[2] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3);
        DrawList._IdxWritePtr[3] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1);
        DrawList._IdxWritePtr[4] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3 - intersect);
        DrawList._IdxWritePtr[5] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 4);
        DrawList._IdxWritePtr += 6;
        DrawList._VtxCurrentIdx += 5;
        P11 = P21;
        P12 = P22;
        return true;
    }